

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O0

Gia_Man_t *
Bmc_BmciPart(Gia_Man_t *pNew,Vec_Int_t *vSatMap,Vec_Int_t *vMiters,Vec_Int_t *vPartMap,
            Vec_Int_t *vCopies)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pPart_00;
  char *pcVar3;
  int iLitPart;
  int iLit;
  int i;
  Gia_Man_t *pPart;
  Vec_Int_t *vCopies_local;
  Vec_Int_t *vPartMap_local;
  Vec_Int_t *vMiters_local;
  Vec_Int_t *vSatMap_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Gia_ManObjNum(pNew);
  Vec_IntFill(vCopies,iVar1,0);
  iVar1 = Gia_ManObjNum(pNew);
  Vec_IntFillExtra(vSatMap,iVar1,-1);
  pPart_00 = Gia_ManStart(1000);
  pcVar3 = Abc_UtilStrsav(pNew->pName);
  pPart_00->pName = pcVar3;
  Vec_IntClear(vPartMap);
  Vec_IntPush(vPartMap,0);
  for (iLitPart = 0; iVar1 = Vec_IntSize(vMiters), iLitPart < iVar1; iLitPart = iLitPart + 1) {
    iVar1 = Vec_IntEntry(vMiters,iLitPart);
    if (iVar1 != -1) {
      if (iVar1 < 2) {
        __assert_fail("iLit >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                      ,0x9b,
                      "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar2 = Abc_Lit2Var(iVar1);
      iVar2 = Bmc_BmciPart_rec(pNew,vSatMap,iVar2,pPart_00,vPartMap,vCopies);
      iVar1 = Abc_LitIsCompl(iVar1);
      iVar1 = Abc_LitNotCond(iVar2,iVar1);
      Gia_ManAppendCo(pPart_00,iVar1);
      Vec_IntPush(vPartMap,-1);
    }
  }
  iVar1 = Gia_ManPoNum(pPart_00);
  if (0 < iVar1) {
    iVar1 = Vec_IntSize(vPartMap);
    iVar2 = Gia_ManObjNum(pPart_00);
    if (iVar1 == iVar2) {
      return pPart_00;
    }
    __assert_fail("Vec_IntSize(vPartMap) == Gia_ManObjNum(pPart)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                  ,0xa1,
                  "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  __assert_fail("Gia_ManPoNum(pPart) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmci.c"
                ,0xa0,
                "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

Gia_Man_t * Bmc_BmciPart( Gia_Man_t * pNew, Vec_Int_t * vSatMap, Vec_Int_t * vMiters, Vec_Int_t * vPartMap, Vec_Int_t * vCopies )
{
    Gia_Man_t * pPart;
    int i, iLit, iLitPart;
    Vec_IntFill( vCopies, Gia_ManObjNum(pNew), 0 );
    Vec_IntFillExtra( vSatMap, Gia_ManObjNum(pNew), -1 );
    pPart = Gia_ManStart( 1000 );
    pPart->pName = Abc_UtilStrsav( pNew->pName );
    Vec_IntClear( vPartMap );
    Vec_IntPush( vPartMap, 0 );
    Vec_IntForEachEntry( vMiters, iLit, i )
    {
        if ( iLit == -1 )
            continue;
        assert( iLit >= 2 );
        iLitPart = Bmc_BmciPart_rec( pNew, vSatMap, Abc_Lit2Var(iLit), pPart, vPartMap, vCopies );
        Gia_ManAppendCo( pPart, Abc_LitNotCond(iLitPart, Abc_LitIsCompl(iLit)) );
        Vec_IntPush( vPartMap, -1 );
    }
    assert( Gia_ManPoNum(pPart) > 0 );
    assert( Vec_IntSize(vPartMap) == Gia_ManObjNum(pPart) );
    return pPart;
}